

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReportBuilder.cpp
# Opt level: O1

void __thiscall KDReports::ReportBuilder::addVariable(ReportBuilder *this,VariableType variable)

{
  MoveMode pos;
  QTextCursor docCursor;
  QString value;
  QTextCharFormat origCharFormat;
  TextElement element;
  QTextCursor local_90 [8];
  QArrayDataPointer<char16_t> local_88;
  QTextFormat local_70 [16];
  QTextFormat local_60 [16];
  TextElement local_50;
  QArrayDataPointer<char16_t> local_38;
  
  TextDocumentData::aboutToModifyContents(this->m_contentDocument,Append);
  pos = QTextCursor::position();
  if (variable == PageCount) {
    local_88.d = (Data *)0x0;
    local_88.ptr = L"UNKNOWN YET";
    local_88.size = 0xb;
    local_38.d = (Data *)0x0;
    local_38.ptr = (char16_t *)0x0;
    local_38.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
  else {
    variableValue((QString *)&local_88,0,this->m_report,variable);
  }
  TextElement::TextElement(&local_50,(QString *)&local_88);
  QTextCursor::charFormat();
  QTextCursor::QTextCursor(local_90,&this->m_contentDocument->m_document);
  QTextCursor::setPosition((int)local_90,pos);
  QTextCursor::charFormat();
  QTextCursor::setCharFormat((QTextCharFormat *)&this->m_cursor);
  QTextFormat::~QTextFormat(local_70);
  QTextCursor::beginEditBlock();
  TextElement::build(&local_50,this);
  QTextCursor::endEditBlock();
  setVariableMarker(&this->m_contentDocument->m_document,pos,variable,(int)local_88.size);
  QTextCursor::setCharFormat((QTextCharFormat *)&this->m_cursor);
  QTextCursor::~QTextCursor(local_90);
  QTextFormat::~QTextFormat(local_60);
  TextElement::~TextElement(&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  return;
}

Assistant:

void KDReports::ReportBuilder::addVariable(KDReports::VariableType variable)
{
    QTextCursor &cursor = this->cursor();
    const int charPosition = cursor.position();
    // Don't ask for the value of PageCount yet -- it would create a documentlayout
    // which would make any later insertion into the textdocument much, much slower.
    const QString value = variable == KDReports::PageCount ? QStringLiteral("UNKNOWN YET") : variableValue(0 /*pageNumber*/, m_report, variable);
    KDReports::TextElement element(value);

    const QTextCharFormat origCharFormat = cursor.charFormat();

    // Keep the current font (KDRE-91).
    QTextCursor docCursor(&currentDocument());
    docCursor.setPosition(charPosition);
    cursor.setCharFormat(docCursor.charFormat());

    cursor.beginEditBlock();
    element.build(*this);
    cursor.endEditBlock();

    setVariableMarker(currentDocument(), charPosition, variable, value.length());

    cursor.setCharFormat(origCharFormat); // restore the orig format
}